

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O1

ggml_backend_t ggml_backend_cpu_init(void)

{
  undefined4 *puVar1;
  ggml_backend_t pgVar2;
  ggml_backend_dev_t pgVar3;
  
  ggml_cpu_init();
  puVar1 = (undefined4 *)operator_new(0x30);
  *puVar1 = 4;
  *(undefined8 *)(puVar1 + 2) = 0;
  *(undefined8 *)(puVar1 + 4) = 0;
  *(undefined8 *)(puVar1 + 6) = 0;
  *(undefined8 *)(puVar1 + 8) = 0;
  *(undefined8 *)(puVar1 + 10) = 0;
  pgVar2 = (ggml_backend_t)operator_new(0x80);
  pgVar2->guid = (ggml_guid_t)ggml_backend_cpu_guid()::guid;
  (pgVar2->iface).get_name = ggml_backend_cpu_get_name;
  (pgVar2->iface).free = ggml_backend_cpu_free;
  (pgVar2->iface).set_tensor_async =
       (_func_void_ggml_backend_t_ggml_tensor_ptr_void_ptr_size_t_size_t *)0x0;
  (pgVar2->iface).get_tensor_async =
       (_func_void_ggml_backend_t_ggml_tensor_ptr_void_ptr_size_t_size_t *)0x0;
  (pgVar2->iface).cpy_tensor_async =
       (_func__Bool_ggml_backend_t_ggml_backend_t_ggml_tensor_ptr_ggml_tensor_ptr *)0x0;
  (pgVar2->iface).synchronize = (_func_void_ggml_backend_t *)0x0;
  (pgVar2->iface).graph_plan_create = ggml_backend_cpu_graph_plan_create;
  (pgVar2->iface).graph_plan_free = ggml_backend_cpu_graph_plan_free;
  (pgVar2->iface).synchronize = (_func_void_ggml_backend_t *)0x0;
  (pgVar2->iface).graph_plan_create = ggml_backend_cpu_graph_plan_create;
  (pgVar2->iface).graph_plan_free = ggml_backend_cpu_graph_plan_free;
  (pgVar2->iface).graph_plan_update =
       (_func_void_ggml_backend_t_ggml_backend_graph_plan_t_ggml_cgraph_ptr *)0x0;
  (pgVar2->iface).graph_plan_compute = ggml_backend_cpu_graph_plan_compute;
  (pgVar2->iface).graph_compute = ggml_backend_cpu_graph_compute;
  (pgVar2->iface).event_record = (_func_void_ggml_backend_t_ggml_backend_event_t *)0x0;
  (pgVar2->iface).event_wait = (_func_void_ggml_backend_t_ggml_backend_event_t *)0x0;
  ggml_cpu_init();
  pgVar3 = (ggml_backend_dev_t)
           ggml_backend_reg_dev_get(&ggml_backend_cpu_reg::ggml_backend_cpu_reg,0);
  pgVar2->device = pgVar3;
  pgVar2->context = puVar1;
  return pgVar2;
}

Assistant:

ggml_backend_t ggml_backend_cpu_init(void) {
    // initialize CPU backend now to avoid slowing the first graph computation
    ggml_cpu_init();

    struct ggml_backend_cpu_context * ctx = new ggml_backend_cpu_context;
    if (ctx == NULL) {
        return NULL;
    }

    ctx->n_threads           = GGML_DEFAULT_N_THREADS;
    ctx->threadpool          = NULL;
    ctx->work_data           = NULL;
    ctx->work_size           = 0;
    ctx->abort_callback      = NULL;
    ctx->abort_callback_data = NULL;

    ggml_backend_t cpu_backend = new ggml_backend {
        /* .guid      = */ ggml_backend_cpu_guid(),
        /* .interface = */ ggml_backend_cpu_i,
        /* .device    = */ ggml_backend_reg_dev_get(ggml_backend_cpu_reg(), 0),
        /* .context   = */ ctx,
    };

    if (cpu_backend == NULL) {
        delete ctx;
        return NULL;
    }

    return cpu_backend;
}